

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O2

void __thiscall EventDispatcherTests::Run(EventDispatcherTests *this)

{
  allocator local_209;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  std::__cxx11::string::string(local_128,"event dispatcher with attached handlers",&local_209);
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:144:52)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:144:52)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[4])
            (this,local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::string
            (local_148,"dispatching an event that has no related handlers is valid",&local_209);
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:157:70)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:157:70)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_148);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::string
            (local_168,"dispatching an event that has multiple related handlers",&local_209);
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:161:67)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:161:67)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::string(local_188,"the expected handlers were called",&local_209);
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:167:45)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:167:45)>
             ::_M_manager;
  local_88._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_188);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::string
            (local_1a8,
             "removing and handler and dispatching an event that had that related handlers",
             &local_209);
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:172:88)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:172:88)>
             ::_M_manager;
  local_a8._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_1a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::string(local_1c8,"the removed handler was not called",&local_209);
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:180:46)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:180:46)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::string
            (local_1e8,
             "adding a handler where the handler deconstructs before the event is dispatched",
             &local_209);
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:185:90)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:185:90)>
             ::_M_manager;
  local_e8._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_1e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::string(local_208,"the handler was not called",&local_209);
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:194:38)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:194:38)>
             ::_M_manager;
  local_108._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_208);
  std::_Function_base::~_Function_base((_Function_base *)&local_108);
  std::__cxx11::string::~string(local_208);
  return;
}

Assistant:

virtual void Run()
	{
		Given("event dispatcher with attached handlers", [&]()
		{
			m_eventHandler[0] = ed::EventDispatcherHandler();
			m_eventHandler[1] = ed::EventDispatcherHandler();

			m_mockTestEvent1Handler[0] = ut11::Mock<void(TestEvent<1>)>();
			m_mockTestEvent1Handler[1] = ut11::Mock<void(TestEvent<1>)>();

			m_eventDispatcher = std::unique_ptr<ed::EventDispatcher>(new ed::EventDispatcher());
	
			m_eventHandler[0] = m_eventDispatcher->addHandler(std::function<void(TestEvent<1>)>(std::ref(m_mockTestEvent1Handler[0])));
			m_eventHandler[1] = m_eventDispatcher->addHandler(std::function<void(TestEvent<1>)>(std::ref(m_mockTestEvent1Handler[1])));
		});
		Then("dispatching an event that has no related handlers is valid", [&]()
		{
			m_eventDispatcher->dispatch(TestEvent<2>(m_expectedValue));
		});
		When("dispatching an event that has multiple related handlers", [&]()
		{
			m_expectedValue = 5;

			m_eventDispatcher->dispatch(TestEvent<1>(m_expectedValue));
		});
		Then("the expected handlers were called", [&]()
		{
			MockVerifyTimes(1, m_mockTestEvent1Handler[0])(TestEvent<1>(m_expectedValue));
			MockVerifyTimes(1, m_mockTestEvent1Handler[1])(TestEvent<1>(m_expectedValue));
		});
		When("removing and handler and dispatching an event that had that related handlers", [&]()
		{
			m_eventHandler[0] = ed::EventDispatcherHandler();

			m_expectedValue = 5;

			m_eventDispatcher->dispatch(TestEvent<1>(m_expectedValue));
		});
		Then("the removed handler was not called", [&]()
		{
			MockVerifyTimes(0, m_mockTestEvent1Handler[0])(ut11::Is::Any<TestEvent<1>>());
			MockVerifyTimes(1, m_mockTestEvent1Handler[1])(TestEvent<1>(m_expectedValue));
		});
		When("adding a handler where the handler deconstructs before the event is dispatched", [&]()
		{
			m_eventHandler[0] = ed::EventDispatcherHandler();
			{ auto otherHandler = m_eventDispatcher->addHandler(std::function<void(TestEvent<1>)>(std::ref(m_mockTestEvent1Handler[0]))); }

			m_expectedValue = 5;

			m_eventDispatcher->dispatch(TestEvent<1>(m_expectedValue));
		});
		Then("the handler was not called", [&]()
		{
			MockVerifyTimes(0, m_mockTestEvent1Handler[0])(ut11::Is::Any<TestEvent<1>>());
			MockVerifyTimes(1, m_mockTestEvent1Handler[1])(TestEvent<1>(m_expectedValue));
		});
	}